

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O1

void chrono::collision::get_centroid_geometries
               (PQP_REAL *c,
               vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               *mgeos,int firstgeo,int ngeos)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  Vector baricenter;
  double local_48;
  double local_40;
  double local_38;
  
  *c = 0.0;
  c[1] = 0.0;
  c[2] = 0.0;
  if (0 < ngeos) {
    lVar1 = (long)firstgeo;
    uVar2 = (ulong)(uint)ngeos;
    do {
      (*(mgeos->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar1]->_vptr_ChGeometry[6])(&local_48);
      *c = local_48 + *c;
      c[1] = local_40 + c[1];
      c[2] = local_38 + c[2];
      lVar1 = lVar1 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  dVar3 = (double)ngeos;
  *c = *c / dVar3;
  c[1] = c[1] / dVar3;
  c[2] = c[2] / dVar3;
  return;
}

Assistant:

void get_centroid_geometries(PQP_REAL c[3], std::vector<geometry::ChGeometry*>& mgeos, int firstgeo, int ngeos) {
    c[0] = c[1] = c[2] = 0.0;

    // get center of mass
    geometry::ChGeometry* nit;
    for (int count = 0; count < ngeos; ++count) {
        nit = mgeos[firstgeo + count];

        Vector baricenter = nit->Baricenter();

        c[0] += baricenter.x();
        c[1] += baricenter.y();
        c[2] += baricenter.z();
    }

    c[0] /= ngeos;
    c[1] /= ngeos;
    c[2] /= ngeos;
}